

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  Arena *arena;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__CodeGeneratorResponse_00318610;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->file_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
            (&(this->file_).super_RepeatedPtrFieldBase,&(from->file_).super_RepeatedPtrFieldBase);
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  (this->error_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    arena = *(Arena **)&this->field_0x8;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance(&this->error_,arena,(from->error_).ptr_);
  }
  this->supported_features_ = from->supported_features_;
  return;
}

Assistant:

CodeGeneratorResponse::CodeGeneratorResponse(const CodeGeneratorResponse& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      file_(from.file_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  error_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_error()) {
    error_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_error(),
      GetArena());
  }
  supported_features_ = from.supported_features_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse)
}